

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

void get_tmfromtime(tm_conflict *tm,time_t *t)

{
  time_t *t_local;
  tm_conflict *tm_local;
  
  tzset();
  localtime_r(t,(tm *)tm);
  return;
}

Assistant:

static void
get_tmfromtime(struct tm *tm, time_t *t)
{
#if HAVE_LOCALTIME_S
	localtime_s(tm, t);
#elif HAVE_LOCALTIME_R
	tzset();
	localtime_r(t, tm);
#else
	memcpy(tm, localtime(t), sizeof(*tm));
#endif
}